

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

BinaryOp * __thiscall verilogAST::BinaryOp::clone_impl(BinaryOp *this)

{
  BinOp op;
  BinaryOp *this_00;
  pointer pEVar1;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *in_R8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30 [3];
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_18;
  BinaryOp *local_10;
  BinaryOp *this_local;
  
  local_10 = this;
  this_00 = (BinaryOp *)operator_new(0x20);
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->left);
  Expression::clone((Expression *)&local_18,(__fn *)pEVar1,__child_stack,in_ECX,in_R8);
  op = this->op;
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->right);
  Expression::clone((Expression *)local_30,(__fn *)pEVar1,__child_stack_00,in_ECX,in_R8);
  BinaryOp(this_00,&local_18,op,local_30);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_30);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_18);
  return this_00;
}

Assistant:

virtual BinaryOp* clone_impl() const override {
    return new BinaryOp(this->left->clone(), this->op, this->right->clone());
  }